

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O0

void __thiscall OpenMD::HBondJumpZ::postCorrelate(HBondJumpZ *this)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RDI;
  uint j;
  uint i;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(uint *)(in_RDI + 0x38); local_c = local_c + 1) {
    for (local_10 = 0; local_10 < *(uint *)(in_RDI + 0x1188); local_10 = local_10 + 1) {
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x1158),(ulong)local_c);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(ulong)local_10);
      if (*pvVar4 < 1) {
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x1140),(ulong)local_c);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_10);
        *pvVar6 = 0.0;
      }
      else {
        pvVar3 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x1158),(ulong)local_c);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(ulong)local_10);
        iVar2 = *pvVar4;
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x1140),(ulong)local_c);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_10);
        *pvVar6 = *pvVar6 / (double)iVar2;
      }
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x1140),(ulong)local_c);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_10);
      dVar1 = *pvVar6;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x1140),(ulong)local_c);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_10);
      *pvVar6 = 1.0 - dVar1;
    }
  }
  return;
}

Assistant:

void HBondJumpZ::postCorrelate() {
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      for (unsigned int j = 0; j < nZBins_; ++j) {
        if (counts_[i][j] > 0) {
          histogram_[i][j] /= counts_[i][j];
        } else {
          histogram_[i][j] = 0;
        }
        histogram_[i][j] = 1.0 - histogram_[i][j];
      }
    }
  }